

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::EnumValue::EnumValue(EnumValue *this,EnumValue *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  string *value;
  Arena *arena;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__EnumValue_003e38c8
  ;
  RepeatedPtrField<google::protobuf::Option>::RepeatedPtrField(&this->options_,&from->options_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  value = (from->name_).ptr_;
  if (value->_M_string_length != 0) {
    arena = (Arena *)this_00->ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,value,arena);
  }
  this->number_ = from->number_;
  return;
}

Assistant:

EnumValue::EnumValue(const EnumValue& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      options_(from.options_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_name().empty()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  number_ = from.number_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumValue)
}